

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# globals.c
# Opt level: O3

void xmlInitGlobalState(xmlGlobalStatePtr gs)

{
  uint uVar1;
  
  uVar1 = xmlGlobalRandom();
  gs->localRngState[0] = uVar1;
  uVar1 = xmlGlobalRandom();
  gs->localRngState[1] = uVar1;
  (gs->lastError).domain = 0;
  (gs->lastError).code = 0;
  (gs->lastError).message = (char *)0x0;
  *(undefined8 *)&(gs->lastError).level = 0;
  (gs->lastError).file = (char *)0x0;
  *(undefined8 *)&(gs->lastError).line = 0;
  (gs->lastError).str1 = (char *)0x0;
  (gs->lastError).str2 = (char *)0x0;
  (gs->lastError).str3 = (char *)0x0;
  (gs->lastError).int1 = 0;
  (gs->lastError).int2 = 0;
  (gs->lastError).ctxt = (void *)0x0;
  (gs->lastError).node = (void *)0x0;
  xmlMutexLock(&xmlThrDefMutex);
  gs->doValidityCheckingDefaultValue = xmlDoValidityCheckingDefaultValueThrDef;
  gs->getWarningsDefaultValue = xmlGetWarningsDefaultValueThrDef;
  gs->keepBlanksDefaultValue = xmlKeepBlanksDefaultValueThrDef;
  gs->lineNumbersDefaultValue = xmlLineNumbersDefaultValueThrDef;
  gs->loadExtDtdDefaultValue = xmlLoadExtDtdDefaultValueThrDef;
  gs->pedanticParserDefaultValue = xmlPedanticParserDefaultValueThrDef;
  gs->substituteEntitiesDefaultValue = xmlSubstituteEntitiesDefaultValueThrDef;
  gs->indentTreeOutput = xmlIndentTreeOutputThrDef;
  gs->treeIndentString = xmlTreeIndentStringThrDef;
  gs->saveNoEmptyTags = xmlSaveNoEmptyTagsThrDef;
  gs->genericError = xmlGenericErrorThrDef;
  gs->structuredError = xmlStructuredErrorThrDef;
  gs->genericErrorContext = xmlGenericErrorContextThrDef;
  gs->structuredErrorContext = xmlStructuredErrorContextThrDef;
  gs->registerNodeDefaultValue = xmlRegisterNodeDefaultValueThrDef;
  gs->deregisterNodeDefaultValue = xmlDeregisterNodeDefaultValueThrDef;
  gs->parserInputBufferCreateFilenameValue = xmlParserInputBufferCreateFilenameValueThrDef;
  gs->outputBufferCreateFilenameValue = xmlOutputBufferCreateFilenameValueThrDef;
  xmlMutexUnlock(&xmlThrDefMutex);
  pthread_setspecific(globalkey,gs);
  return;
}

Assistant:

static void
xmlInitGlobalState(xmlGlobalStatePtr gs) {
    gs->localRngState[0] = xmlGlobalRandom();
    gs->localRngState[1] = xmlGlobalRandom();

    memset(&gs->lastError, 0, sizeof(xmlError));

#ifdef LIBXML_THREAD_ALLOC_ENABLED
    /* XML_GLOBALS_ALLOC */
    gs->free = free;
    gs->malloc = malloc;
    gs->mallocAtomic = malloc;
    gs->realloc = realloc;
    gs->memStrdup = xmlPosixStrdup;
#endif

    xmlMutexLock(&xmlThrDefMutex);

    /* XML_GLOBALS_PARSER */
    gs->doValidityCheckingDefaultValue =
         xmlDoValidityCheckingDefaultValueThrDef;
    gs->getWarningsDefaultValue = xmlGetWarningsDefaultValueThrDef;
    gs->keepBlanksDefaultValue = xmlKeepBlanksDefaultValueThrDef;
    gs->lineNumbersDefaultValue = xmlLineNumbersDefaultValueThrDef;
    gs->loadExtDtdDefaultValue = xmlLoadExtDtdDefaultValueThrDef;
    gs->pedanticParserDefaultValue = xmlPedanticParserDefaultValueThrDef;
    gs->substituteEntitiesDefaultValue =
        xmlSubstituteEntitiesDefaultValueThrDef;
#ifdef LIBXML_OUTPUT_ENABLED
    gs->indentTreeOutput = xmlIndentTreeOutputThrDef;
    gs->treeIndentString = xmlTreeIndentStringThrDef;
    gs->saveNoEmptyTags = xmlSaveNoEmptyTagsThrDef;
#endif

    /* XML_GLOBALS_ERROR */
    gs->genericError = xmlGenericErrorThrDef;
    gs->structuredError = xmlStructuredErrorThrDef;
    gs->genericErrorContext = xmlGenericErrorContextThrDef;
    gs->structuredErrorContext = xmlStructuredErrorContextThrDef;

    /* XML_GLOBALS_TREE */
    gs->registerNodeDefaultValue = xmlRegisterNodeDefaultValueThrDef;
    gs->deregisterNodeDefaultValue = xmlDeregisterNodeDefaultValueThrDef;

    /* XML_GLOBALS_IO */
    gs->parserInputBufferCreateFilenameValue =
        xmlParserInputBufferCreateFilenameValueThrDef;
    gs->outputBufferCreateFilenameValue =
        xmlOutputBufferCreateFilenameValueThrDef;

    xmlMutexUnlock(&xmlThrDefMutex);

#ifdef USE_TLS
    gs->initialized = 1;
#endif

#ifdef HAVE_POSIX_THREADS
    pthread_setspecific(globalkey, gs);
#elif defined HAVE_WIN32_THREADS
#ifndef USE_TLS
    TlsSetValue(globalkey, gs);
#endif
#ifdef USE_WAIT_DTOR
    xmlRegisterGlobalStateDtor(gs);
#endif
#endif
}